

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<unsigned_short_(unsigned_short)>::PrintTriedExpectationsLocked
          (FunctionMockerBase<unsigned_short_(unsigned_short)> *this,ArgumentTuple *args,
          ostream *why)

{
  int iVar1;
  size_type sVar2;
  ostream *poVar3;
  const_reference this_00;
  TypedExpectation<unsigned_short_(unsigned_short)> *this_01;
  char *pcVar4;
  TypedExpectation<unsigned_short_(unsigned_short)> *expectation;
  int i;
  int count;
  ostream *why_local;
  ArgumentTuple *args_local;
  FunctionMockerBase<unsigned_short_(unsigned_short)> *this_local;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  sVar2 = std::
          vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
          ::size(&(this->super_UntypedFunctionMockerBase).untyped_expectations_);
  iVar1 = (int)sVar2;
  poVar3 = std::operator<<(why,"Google Mock tried the following ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar1);
  poVar3 = std::operator<<(poVar3," ");
  pcVar4 = "expectations, but none matched";
  if (iVar1 == 1) {
    pcVar4 = "expectation, but it didn\'t match";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3,":\n");
  for (expectation._0_4_ = 0; (int)expectation < iVar1; expectation._0_4_ = (int)expectation + 1) {
    this_00 = std::
              vector<testing::internal::linked_ptr<testing::internal::ExpectationBase>,_std::allocator<testing::internal::linked_ptr<testing::internal::ExpectationBase>_>_>
              ::operator[](&(this->super_UntypedFunctionMockerBase).untyped_expectations_,
                           (long)(int)expectation);
    this_01 = (TypedExpectation<unsigned_short_(unsigned_short)> *)
              linked_ptr<testing::internal::ExpectationBase>::get(this_00);
    std::operator<<(why,"\n");
    ExpectationBase::DescribeLocationTo((ExpectationBase *)this_01,why);
    if (1 < iVar1) {
      poVar3 = std::operator<<(why,"tried expectation #");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(int)expectation);
      std::operator<<(poVar3,": ");
    }
    pcVar4 = ExpectationBase::source_text((ExpectationBase *)this_01);
    poVar3 = std::operator<<(why,pcVar4);
    std::operator<<(poVar3,"...\n");
    TypedExpectation<unsigned_short_(unsigned_short)>::ExplainMatchResultTo(this_01,args,why);
    ExpectationBase::DescribeCallCountTo((ExpectationBase *)this_01,why);
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    const int count = static_cast<int>(untyped_expectations_.size());
    *why << "Google Mock tried the following " << count << " "
         << (count == 1 ? "expectation, but it didn't match" :
             "expectations, but none matched")
         << ":\n";
    for (int i = 0; i < count; i++) {
      TypedExpectation<F>* const expectation =
          static_cast<TypedExpectation<F>*>(untyped_expectations_[i].get());
      *why << "\n";
      expectation->DescribeLocationTo(why);
      if (count > 1) {
        *why << "tried expectation #" << i << ": ";
      }
      *why << expectation->source_text() << "...\n";
      expectation->ExplainMatchResultTo(args, why);
      expectation->DescribeCallCountTo(why);
    }
  }